

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_multi.cc
# Opt level: O2

void init_leaf(node *n)

{
  n->internal = false;
  v_array<node_pred>::clear(&n->preds);
  n->base_predictor = 0;
  n->left = 0;
  *(undefined8 *)&n->norm_Eh = 0;
  *(undefined8 *)((long)&n->Eh + 4) = 0;
  n->max_count = 0;
  n->max_count_label = 1;
  n->right = 0;
  return;
}

Assistant:

inline void init_leaf(node& n)
{
  n.internal = false;
  n.preds.clear();
  n.base_predictor = 0;
  n.norm_Eh = 0;
  n.Eh = 0;
  n.n = 0;
  n.max_count = 0;
  n.max_count_label = 1;
  n.left = 0;
  n.right = 0;
}